

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statement.cpp
# Opt level: O2

TStatementPtr __thiscall SQLite::Statement::prepareStatement(Statement *this)

{
  int ret;
  undefined8 *puVar1;
  Exception *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined8 *in_RSI;
  TStatementPtr TVar2;
  __allocator_type __a2;
  sqlite3_stmt *statement;
  __allocated_ptr<std::allocator<std::_Sp_counted_deleter<sqlite3_stmt_*,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_tripplet[P]vbus_server_SQLiteCpp_src_Statement_cpp:368:48),_std::allocator<void>,_(__gnu_cxx::_Lock_policy)2>_>_>
  local_28;
  
  ret = sqlite3_prepare_v2((sqlite3 *)in_RSI[4],(char *)*in_RSI,*(int *)(in_RSI + 1),&statement,
                           (char **)0x0);
  if (ret == 0) {
    (this->mQuery)._M_dataplus._M_p = (pointer)statement;
    (this->mQuery)._M_string_length = 0;
    puVar1 = (undefined8 *)operator_new(0x18);
    local_28._M_alloc = &__a2;
    puVar1[1] = 0x100000001;
    *puVar1 = &PTR___Sp_counted_base_001db068;
    puVar1[2] = statement;
    (this->mQuery)._M_string_length = (size_type)puVar1;
    local_28._M_ptr = (pointer)0x0;
    std::
    __allocated_ptr<std::allocator<std::_Sp_counted_deleter<sqlite3_stmt_*,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/tripplet[P]vbus-server/SQLiteCpp/src/Statement.cpp:368:48),_std::allocator<void>,_(__gnu_cxx::_Lock_policy)2>_>_>
    ::~__allocated_ptr(&local_28);
    TVar2.super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    TVar2.super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
    ;
    return (TStatementPtr)TVar2.super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x18);
  Exception::Exception(this_00,(sqlite3 *)in_RSI[4],ret);
  __cxa_throw(this_00,&Exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Statement::TStatementPtr Statement::prepareStatement()
{
    sqlite3_stmt* statement;
    const int ret = sqlite3_prepare_v2(mpSQLite, mQuery.c_str(), static_cast<int>(mQuery.size()), &statement, nullptr);
    if (SQLITE_OK != ret)
    {
        throw SQLite::Exception(mpSQLite, ret);
    }
    return Statement::TStatementPtr(statement, [](sqlite3_stmt* stmt)
        {
            sqlite3_finalize(stmt);
        });
}